

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O2

void show_includes(LexData *data)

{
  int iVar1;
  int iVar2;
  pointer pTVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  int iVar9;
  int i;
  vector<PPIf,_std::allocator<PPIf>_> stack;
  PPIf ppif;
  string id;
  
  stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  printf("%s: includes\n",(data->fn)._M_dataplus._M_p);
  iVar9 = 0;
  do {
    iVar7 = iVar9 + 2;
    pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)(((long)(data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pTVar3) / 0x14) <= iVar7) {
      std::vector<PPIf,_std::allocator<PPIf>_>::~vector(&stack);
      return;
    }
    lVar5 = (long)iVar9;
    if ((pTVar3[lVar5].kind == PPBegin) && (iVar1 = iVar9 + 1, pTVar3[iVar1].kind == PPKeyword)) {
      iVar2 = pTVar3[iVar1].i;
      if (iVar2 - 5U < 3) {
        ppif.id._M_dataplus._M_p = (pointer)&ppif.id.field_2;
        ppif.id._M_string_length = 0;
        ppif.id.field_2._M_local_buf[0] = '\0';
        if (pTVar3[iVar1].i - 6U < 2) {
          puVar4 = (data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          id._M_dataplus._M_p = (pointer)&id.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&id,puVar4 + pTVar3[iVar7].i,puVar4 + pTVar3[iVar7].j);
          std::__cxx11::string::_M_assign((string *)&ppif);
          ppif.def = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar1].i == 6;
          std::__cxx11::string::~string((string *)&id);
        }
        else if (pTVar3[iVar1].i == 5) {
          std::__cxx11::string::assign((char *)&ppif);
          lVar6 = lVar5 + 2;
          lVar5 = lVar5 * 0x14 + 0x38;
          while( true ) {
            pTVar3 = (data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((int)(((long)(data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x14) <=
                lVar6) break;
            iVar9 = *(int *)((long)pTVar3 + lVar5 + -0x10);
            if ((iVar9 == 5) || (iVar9 == 8)) {
              puVar4 = (data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              id._M_dataplus._M_p = (pointer)&id.field_2;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((string *)&id,puVar4 + *(int *)((long)pTVar3 + lVar5 + -4),
                         puVar4 + *(int *)((long)&pTVar3->kind + lVar5));
              std::__cxx11::string::push_back((char)&ppif);
              std::__cxx11::string::append((string *)&ppif);
              std::__cxx11::string::~string((string *)&id);
            }
            else if (iVar9 == 3) break;
            lVar6 = lVar6 + 1;
            lVar5 = lVar5 + 0x14;
          }
          std::__cxx11::string::append((char *)&ppif);
          ppif.def = true;
          iVar9 = (int)lVar6;
        }
        std::vector<PPIf,_std::allocator<PPIf>_>::push_back(&stack,&ppif);
        std::__cxx11::string::~string((string *)&ppif);
      }
      else if (iVar2 == 3) {
        if (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::vector<PPIf,_std::allocator<PPIf>_>::erase
                    (&stack,stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1);
        }
      }
      else if ((iVar2 == 8) && (pTVar3[iVar7].kind == PPHeaderName)) {
        puVar4 = (data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        ppif.id._M_dataplus._M_p = (pointer)&ppif.id.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((string *)&ppif,puVar4 + pTVar3[iVar7].i,puVar4 + pTVar3[iVar7].j);
        printf("  %s",ppif.id._M_dataplus._M_p);
        if (stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          printf(" (");
          lVar5 = 0;
          for (lVar6 = 0;
              lVar6 < (int)(((long)stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                                  super__Vector_impl_data._M_start) / 0x28); lVar6 = lVar6 + 1) {
            if (lVar5 != 0) {
              printf(" && ",0x28,
                     ((long)stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                           super__Vector_impl_data._M_start) % 0x28);
            }
            pcVar8 = "!";
            if ((&(stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                   super__Vector_impl_data._M_start)->def)[lVar5] != false) {
              pcVar8 = "";
            }
            printf("%s%s",pcVar8,
                   *(undefined8 *)
                    ((long)&((stack.super__Vector_base<PPIf,_std::allocator<PPIf>_>._M_impl.
                              super__Vector_impl_data._M_start)->id)._M_dataplus._M_p + lVar5));
            lVar5 = lVar5 + 0x28;
          }
          putchar(0x29);
        }
        putchar(10);
        std::__cxx11::string::~string((string *)&ppif);
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void show_includes(const LexData& data)
{
  std::vector<PPIf> stack;

  std::printf("%s: includes\n",
              data.fn.c_str());

  for (int i=0; i+2<int(data.tokens.size()); ++i) {
    if (data.tokens[i].kind == TokenKind::PPBegin &&
        data.tokens[i+1].kind == TokenKind::PPKeyword) {
      if (data.tokens[i+1].i == pp_key_if ||
          data.tokens[i+1].i == pp_key_ifdef ||
          data.tokens[i+1].i == pp_key_ifndef) {
        PPIf ppif;
        switch (data.tokens[i+1].i) {
          case pp_key_if: {
            bool first = false;
            ppif.id = "#if (";
            for (i+=2; i<int(data.tokens.size()) &&
                   data.tokens[i].kind != TokenKind::PPEnd; ++i) {
              if (data.tokens[i].kind == TokenKind::Identifier ||
                  data.tokens[i].kind == TokenKind::Literal) {
                std::string lit(data.ids.begin()+data.tokens[i].i,
                                data.ids.begin()+data.tokens[i].j);
                if (first)
                  first = false;
                else
                  ppif.id.push_back(' ');
                ppif.id += lit;
              }
            }
            ppif.id += ")";
            ppif.def = true;
            break;
          }
          case pp_key_ifndef:
          case pp_key_ifdef: {
            std::string id(data.ids.begin()+data.tokens[i+2].i,
                           data.ids.begin()+data.tokens[i+2].j);
            ppif.id = id;
            ppif.def = (data.tokens[i+1].i == pp_key_ifdef);
            break;
          }
        }
        stack.push_back(ppif);
      }
      else if (data.tokens[i+1].i == pp_key_endif) {
        if (!stack.empty())
          stack.erase(--stack.end());
      }
      else if (data.tokens[i+1].i == pp_key_include &&
               data.tokens[i+2].kind == TokenKind::PPHeaderName) {
        std::string str(data.ids.begin()+data.tokens[i+2].i,
                        data.ids.begin()+data.tokens[i+2].j);
        std::printf("  %s", str.c_str());
        if (!stack.empty()) {
          std::printf(" (");
          for (int i=0; i<int(stack.size()); ++i) {
            if (i > 0)
              std::printf(" && ");
            std::printf("%s%s",
                        stack[i].def ? "": "!",
                        stack[i].id.c_str());
          }
          std::printf(")");
        }
        std::printf("\n");
      }
    }
  }
}